

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O3

ChebyshevCollection * __thiscall
ChebTools::ChebyshevCollection::make_inverse
          (ChebyshevCollection *__return_storage_ptr__,ChebyshevCollection *this,size_t N,
          double xmin,double xmax,int Mnorm,double tol,int max_refine_passes,bool assume_monotonic,
          bool unsafe_evaluation)

{
  ulong uVar1;
  double dVar2;
  ChebyshevCollection *this_00;
  VectorXd *pVVar3;
  double *pdVar4;
  undefined8 *puVar5;
  double *pdVar6;
  char *__function;
  ulong uVar7;
  Index index;
  ulong uVar8;
  double dVar9;
  Scalar SVar10;
  double dVar11;
  ArrayXd ynodes;
  double xmax_;
  double xmin_;
  size_t counter;
  vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> exps;
  anon_class_64_8_38687d7a get_xsolns;
  double ytol;
  optional<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
  *in_stack_fffffffffffffe98;
  undefined1 local_159;
  Array<double,__1,_1,_0,__1,_1> local_158;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  ChebyshevCollection *local_128;
  double local_120;
  double local_118;
  uint local_10c;
  double local_108;
  double local_100;
  double local_f8;
  undefined8 local_f0;
  double local_e8;
  double local_e0;
  undefined8 *local_d8;
  undefined8 local_d0;
  code *local_c8;
  code *local_c0;
  vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> local_b8;
  evaluator<Eigen::PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>_> local_a0;
  double *local_98;
  undefined1 *local_90;
  double *local_88;
  double *local_80;
  ChebyshevCollection *local_78;
  double *local_70;
  double *local_68;
  _Optional_payload_base<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
  local_60;
  double local_38;
  
  local_159 = assume_monotonic;
  local_148 = xmax;
  local_128 = (ChebyshevCollection *)xmin;
  local_10c = Mnorm;
  local_108 = xmax;
  local_100 = xmin;
  local_f8 = tol;
  local_e8 = xmax;
  local_e0 = xmin;
  if (unsafe_evaluation) {
    local_138 = y_unsafe(this,xmin);
    dVar9 = y_unsafe(this,local_148);
  }
  else {
    local_138 = operator()(this,xmin);
    dVar9 = operator()(this,local_148);
  }
  local_120 = local_138;
  local_118 = dVar9;
  if (dVar9 < local_138) {
    local_100 = local_148;
    local_108 = (double)local_128;
    local_118 = local_138;
    local_120 = dVar9;
  }
  local_f0 = 0;
  local_148 = dVar9;
  pVVar3 = get_CLnodes(N);
  uVar1 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar1 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
                 );
  }
  dVar11 = local_118 - local_120;
  dVar9 = local_138 + local_148;
  local_158.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_158.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_128 = __return_storage_ptr__;
  if (uVar1 == 0) {
    pdVar6 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar8 = 0;
LAB_0012a3a9:
    if ((long)uVar8 < (long)uVar1) {
      do {
        local_158.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar8] = (pdVar6[uVar8] * dVar11 + dVar9) * 0.5;
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
    local_158.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar1
    ;
    if ((long)uVar1 < 1) {
      __function = 
      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Array<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Array<double, -1, 1>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
      ;
    }
    else {
      local_a0.m_d.data =
           (plainobjectbase_evaluator_data<double,_0>)
           (plainobjectbase_evaluator_data<double,_0>)
           local_158.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      local_138 = Eigen::internal::
                  redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Array<double,-1,1,0,-1,1>>,3,0>
                  ::run<Eigen::Array<double,_1,1,0,_1,1>>
                            ((redux_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&local_a0,
                             (scalar_max_op<double,_double,_0> *)&local_60,&local_158);
      if (0 < local_158.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows) {
        local_a0.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)
             local_158.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
        SVar10 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_min_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Array<double,-1,1,0,-1,1>>,3,0>
                 ::run<Eigen::Array<double,_1,1,0,_1,1>>
                           ((redux_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&local_a0,
                            (scalar_min_op<double,_double,_0> *)&local_60,&local_158);
        local_38 = (local_138 - SVar10) * 2.2e-14;
        local_98 = &local_38;
        local_90 = &local_159;
        local_88 = &local_108;
        local_80 = &local_100;
        local_d0 = 0;
        local_a0.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)&local_158;
        local_78 = this;
        local_70 = &local_e0;
        local_68 = &local_e8;
        local_d8 = (undefined8 *)operator_new(0x20);
        *local_d8 = &local_a0;
        local_d8[1] = &local_e8;
        local_d8[2] = &local_e0;
        local_d8[3] = &local_f0;
        local_c0 = std::
                   _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/include/ChebTools/ChebTools.h:798:22)>
                   ::_M_invoke;
        local_c8 = std::
                   _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/include/ChebTools/ChebTools.h:798:22)>
                   ::_M_manager;
        local_60._M_engaged = false;
        ChebyshevExpansion::
        dyadic_splitting<std::vector<ChebTools::ChebyshevExpansion,std::allocator<ChebTools::ChebyshevExpansion>>>
                  (&local_b8,(ChebyshevExpansion *)N,(size_t)&local_d8,
                   (function<double_(double)> *)(ulong)local_10c,local_120,local_118,
                   max_refine_passes,local_f8,(int)&local_60,in_stack_fffffffffffffe98);
        std::
        _Optional_payload_base<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
        ::_M_reset(&local_60);
        this_00 = local_128;
        if (local_c8 != (code *)0x0) {
          (*local_c8)(&local_d8,&local_d8,3);
        }
        ChebyshevCollection(this_00,&local_b8);
        std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
        ~vector(&local_b8);
        free(local_158.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        return this_00;
      }
      __function = 
      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Array<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Array<double, -1, 1>, BinaryOp = Eigen::internal::scalar_min_op<double>]"
      ;
    }
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                  ,0x19b,__function);
  }
  uStack_140 = 0;
  local_148 = dVar11;
  local_138 = dVar9;
  if (uVar1 < 0x2000000000000000) {
    pdVar4 = (double *)malloc(uVar1 * 8);
    if (uVar1 != 1 && ((ulong)pdVar4 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                    ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar4 != (double *)0x0) {
      pdVar6 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      uVar8 = uVar1 & 0x1ffffffffffffffe;
      dVar9 = local_138;
      dVar11 = local_148;
      local_158.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar4;
      if (uVar1 != 1) {
        uVar7 = 0;
        do {
          dVar2 = (pdVar6 + uVar7)[1];
          pdVar4[uVar7] = (pdVar6[uVar7] * local_148 + local_138) * 0.5;
          (pdVar4 + uVar7)[1] = (dVar2 * local_148 + local_138) * 0.5;
          uVar7 = uVar7 + 2;
        } while (uVar7 < uVar8);
      }
      goto LAB_0012a3a9;
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = std::random_device::_M_fini;
  __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

auto make_inverse(const std::size_t N, const double xmin, const double xmax,
            const int Mnorm, const double tol, const int max_refine_passes = 8, const bool assume_monotonic = true, const bool unsafe_evaluation=false) const {
            double xmin_ = xmin, xmax_ = xmax;
            double yxmin, yxmax;
            if (unsafe_evaluation){
                yxmin = (*this).y_unsafe(xmin); yxmax = (*this).y_unsafe(xmax);
            }
            else{
                yxmin = (*this)(xmin); yxmax = (*this)(xmax);
            }
            if (yxmin > yxmax) {
                std::swap(yxmin, yxmax);
                std::swap(xmin_, xmax_);
            }
            std::size_t counter = 0;

            // These are the values of y at the Chebyshev-Lobatto nodes for the inverse function
            // in the first pass
            Eigen::ArrayXd ynodes = ((yxmax - yxmin) * ChebTools::get_CLnodes(N).array() + (yxmax + yxmin)) * 0.5;
            // A small fudge factor is needed because there is a tiny loss in precision in calculation of ynodes
            // so it is not adequate to check direct float equality
            auto ytol = 2.2e-14*(ynodes.maxCoeff() - ynodes.minCoeff());

            auto get_xsolns = [&](double y) {
                std::vector<double> xsolns;
                auto ranges_overlap = [](double x1, double x2, double y1, double y2) { return x1 <= y2 && y1 <= x2; };

                // If a value of y precisely matches a value at the node, return the value of x at the node
                // This is important if the value of y is an extremum of y(x)
                if (std::abs(y - ynodes[0]) < ytol && assume_monotonic) { xsolns = { xmax_ }; }
                else if (std::abs(y - ynodes[ynodes.size() - 1]) < ytol && assume_monotonic) { xsolns = { xmin_ }; }
                else {
                    // Solve for values of x given this value of y
                    for (auto& ex : m_exps) {
                        if (assume_monotonic) {
                            auto yvals = ex.get_node_function_values();
                            auto ymin = yvals(0), ymax = yvals(yvals.size() - 1);
                            if (ymin > ymax) {
                                std::swap(ymin, ymax);
                            }
                            if (y >= ymin && y <= ymax) {
                                xsolns.emplace_back(ex.monotonic_solvex(y));
                            }
                        }
                        else {
                            if (ranges_overlap(ex.xmin(), ex.xmax(), xmin, xmax)) {
                                bool only_in_domain = true;
                                for (auto& rt : (ex - y).real_roots2(only_in_domain)) {
                                    xsolns.emplace_back(rt);
                                }
                                bool no_solns = xsolns.empty();
                                if (no_solns){
                                    if (std::abs(y - ynodes[0]) < ytol) { xsolns.push_back(xmax_); }
                                    if (std::abs(y - ynodes[ynodes.size() - 1]) < ytol) { xsolns.push_back(xmin_); }
                                }
                            }
                        }
                    }
                }
                return xsolns;
            };

            auto f = [&](double y) {
                
                auto xsolns = get_xsolns(y);
                auto xtol = 1e-14*(xmax - xmin);
                
                counter++;
                decltype(xsolns) good_solns;
                for (auto & xsoln : xsolns) {
                    if (xsoln >= xmin-xtol && xsoln <= xmax+xtol) {
                        good_solns.push_back(xsoln);
                    }
                }
                auto Ngood_solns = good_solns.size();
                if (Ngood_solns == 1) {
                    return good_solns.front();
                }
                else if (Ngood_solns == 0) {
                    throw std::invalid_argument("No good solutions found for y: " + std::to_string(y) + "; " + std::to_string(xsolns.size()) + " solutions had been found");
                }
                else {
                    for (auto soln : xsolns){
                        std::cout << soln << std::endl;
                    }
                    throw std::invalid_argument("Multiple solutions (is not one-to-one) for y: " + std::to_string(y) + "; " + std::to_string(Ngood_solns) + " solutions found");
                }
            };
            auto exps = ChebyshevExpansion::dyadic_splitting<Container>(N, f, yxmin, yxmax, Mnorm, tol, max_refine_passes);
            return ChebyshevCollection(exps);
        }